

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRC_Client.cpp
# Opt level: O0

size_t __thiscall Jupiter::IRC::Client::messageChannels(Client *this,int type,string_view message)

{
  bool bVar1;
  int iVar2;
  reference ppVar3;
  size_type sVar4;
  string_view dest;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::IRC::Client::Channel>
  *channel;
  iterator __end1;
  iterator __begin1;
  ChannelTableType *__range1;
  int type_local;
  Client *this_local;
  string_view message_local;
  
  __end1 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::IRC::Client::Channel,_jessilib::text_hashi,_jessilib::text_equali,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::IRC::Client::Channel>_>_>
           ::begin(&this->m_channels);
  channel = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::IRC::Client::Channel>
             *)std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::IRC::Client::Channel,_jessilib::text_hashi,_jessilib::text_equali,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::IRC::Client::Channel>_>_>
               ::end(&this->m_channels);
  while( true ) {
    bVar1 = std::__detail::operator==
                      (&__end1.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::IRC::Client::Channel>,_false>
                       ,(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::IRC::Client::Channel>,_false>
                         *)&channel);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    ppVar3 = std::__detail::
             _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::IRC::Client::Channel>,_false,_false>
             ::operator*(&__end1);
    iVar2 = Channel::getType(&ppVar3->second);
    if (iVar2 == type) {
      dest = Channel::getName(&ppVar3->second);
      sendMessage(this,dest,message);
    }
    std::__detail::
    _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::IRC::Client::Channel>,_false,_false>
    ::operator++(&__end1);
  }
  sVar4 = std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::IRC::Client::Channel,_jessilib::text_hashi,_jessilib::text_equali,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::IRC::Client::Channel>_>_>
          ::size(&this->m_channels);
  return sVar4;
}

Assistant:

size_t Jupiter::IRC::Client::messageChannels(int type, std::string_view message) {
	for (auto& channel : m_channels) {
		if (channel.second.getType() == type) {
			sendMessage(channel.second.getName(), message);
		}
	}

	return m_channels.size();
}